

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall
ColumnSampler<double>::initialize<double>(ColumnSampler<double> *this,double *weights,size_t n_cols)

{
  size_type __new_size;
  vector<double,_std::allocator<double>_> *this_00;
  uint64_t uVar1;
  size_t sVar2;
  value_type_conflict in_RAX;
  ulong uVar3;
  long lVar4;
  char cVar5;
  double *pdVar6;
  size_t sVar7;
  double *__s;
  bool bVar8;
  double dVar9;
  value_type_conflict local_28;
  
  this->n_cols = n_cols;
  uVar3 = n_cols - 1 >> 1 | n_cols - 1;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar3 = uVar3 >> 0x10 | uVar3;
  uVar3 = uVar3 >> 0x20 | uVar3;
  uVar1 = tab64[(uVar3 - (uVar3 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
  __new_size = uVar1 + 1;
  this->tree_levels = __new_size;
  this_00 = &this->tree_weights;
  __s = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar6 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  cVar5 = (char)uVar1;
  if (__s == pdVar6) {
    local_28 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              (this_00,1L << (cVar5 + 2U & 0x3f),&local_28);
    __s = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start;
  }
  else {
    local_28 = in_RAX;
    if ((long)pdVar6 - (long)__s >> 3 != 1L << (cVar5 + 2U & 0x3f)) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
      __s = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
      pdVar6 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (__s != pdVar6) {
      memset(__s,0,((long)pdVar6 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
    }
  }
  uVar3 = ~(-1L << ((byte)this->tree_levels & 0x3f));
  this->offset = uVar3;
  sVar2 = this->n_cols;
  if (sVar2 != 0) {
    sVar7 = 0;
    do {
      dVar9 = weights[sVar7];
      if (dVar9 <= 0.0) {
        dVar9 = 0.0;
      }
      __s[uVar3 + sVar7] = dVar9;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  lVar4 = (long)(this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)__s >> 3;
  if (lVar4 != 1) {
    uVar3 = lVar4 - 2;
    do {
      *(double *)((long)__s + (uVar3 & 0xfffffffffffffffe) * 4) =
           __s[uVar3 + 1] + *(double *)((long)__s + (uVar3 & 0xfffffffffffffffe) * 4);
      bVar8 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar8);
  }
  if (*__s <= 0.0) {
    drop_weights(this);
  }
  this->n_dropped = 0;
  return;
}

Assistant:

void ColumnSampler<ldouble_safe>::initialize(real_t weights[], size_t n_cols)
{
    this->n_cols = n_cols;
    this->tree_levels = log2ceil(n_cols);
    if (this->tree_weights.empty())
        this->tree_weights.resize(pow2(this->tree_levels + 1), 0);
    else {
        if (this->tree_weights.size() != pow2(this->tree_levels + 1))
            this->tree_weights.resize(this->tree_levels);
        std::fill(this->tree_weights.begin(), this->tree_weights.end(), 0.);
    }

    /* compute sums for the tree leaves at each node */
    this->offset = pow2(this->tree_levels) - 1;
    for (size_t ix = 0; ix < this->n_cols; ix++)
        this->tree_weights[ix + this->offset] = std::fmax(0., weights[ix]);
    for (size_t ix = this->tree_weights.size() - 1; ix > 0; ix--)
        this->tree_weights[ix_parent(ix)] += this->tree_weights[ix];

    /* if the weights are invalid, make it an unweighted sampler */
    if (unlikely(std::isnan(this->tree_weights[0]) || this->tree_weights[0] <= 0))
    {
        this->drop_weights();
    }

    this->n_dropped = 0;
}